

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_ptr.h
# Opt level: O1

void __thiscall
booster::copy_ptr<cppcms::xss::rules::data>::~copy_ptr(copy_ptr<cppcms::xss::rules::data> *this)

{
  data *pdVar1;
  pointer pcVar2;
  
  pdVar1 = this->ptr_;
  if (pdVar1 != (data *)0x0) {
    pcVar2 = (pdVar1->encoding)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != &(pdVar1->encoding).field_2) {
      operator_delete(pcVar2);
    }
    (pdVar1->html_rules).super_basic_rules_holder._vptr_basic_rules_holder =
         (_func_int **)&PTR_add_tag_0028cec8;
    std::
    _Rb_tree<cppcms::xss::details::c_string,_std::pair<const_cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::icompare_c_string,_false>::tag>,_std::_Select1st<std::pair<const_cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::icompare_c_string,_false>::tag>_>,_cppcms::xss::icompare_c_string,_std::allocator<std::pair<const_cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::icompare_c_string,_false>::tag>_>_>
    ::~_Rb_tree(&(pdVar1->html_rules).tags._M_t);
    (pdVar1->html_rules).super_basic_rules_holder._vptr_basic_rules_holder =
         (_func_int **)&PTR___cxa_pure_virtual_0028ce80;
    std::
    _Rb_tree<cppcms::xss::details::c_string,_cppcms::xss::details::c_string,_std::_Identity<cppcms::xss::details::c_string>,_cppcms::xss::compare_c_string,_std::allocator<cppcms::xss::details::c_string>_>
    ::~_Rb_tree(&(pdVar1->html_rules).super_basic_rules_holder.entities._M_t);
    (pdVar1->xhtml_rules).super_basic_rules_holder._vptr_basic_rules_holder =
         (_func_int **)&PTR_add_tag_0028ce10;
    std::
    _Rb_tree<cppcms::xss::details::c_string,_std::pair<const_cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::compare_c_string,_true>::tag>,_std::_Select1st<std::pair<const_cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::compare_c_string,_true>::tag>_>,_cppcms::xss::compare_c_string,_std::allocator<std::pair<const_cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::compare_c_string,_true>::tag>_>_>
    ::~_Rb_tree(&(pdVar1->xhtml_rules).tags._M_t);
    (pdVar1->xhtml_rules).super_basic_rules_holder._vptr_basic_rules_holder =
         (_func_int **)&PTR___cxa_pure_virtual_0028ce80;
    std::
    _Rb_tree<cppcms::xss::details::c_string,_cppcms::xss::details::c_string,_std::_Identity<cppcms::xss::details::c_string>,_cppcms::xss::compare_c_string,_std::allocator<cppcms::xss::details::c_string>_>
    ::~_Rb_tree(&(pdVar1->xhtml_rules).super_basic_rules_holder.entities._M_t);
    operator_delete(pdVar1);
    return;
  }
  return;
}

Assistant:

~copy_ptr() {
			if(ptr_) delete ptr_;
		}